

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles31::Functional::FboTestCase::iterate(FboTestCase *this)

{
  ContextWrapper *this_00;
  ContextType *pCVar1;
  RenderContext *context_00;
  TestLog *log;
  int width;
  int height;
  int iVar2;
  deUint32 dVar3;
  ChannelOrder CVar4;
  ChannelType CVar5;
  undefined4 extraout_var;
  Error *this_01;
  char *description;
  Surface result;
  Surface reference;
  Random rnd;
  ReferenceContextBuffers buffers;
  code *local_62b0;
  deUint32 local_62a8;
  MultisamplePixelBufferAccess local_6258;
  MultisamplePixelBufferAccess local_6230;
  MultisamplePixelBufferAccess local_6208;
  GLContext context;
  int *piVar6;
  
  context_00 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*context_00->_vptr_RenderContext[4])();
  piVar6 = (int *)CONCAT44(extraout_var,iVar2);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar3 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar3);
  iVar2 = *piVar6;
  width = this->m_viewportWidth;
  if (iVar2 < this->m_viewportWidth) {
    width = iVar2;
  }
  height = this->m_viewportHeight;
  if (piVar6[1] < this->m_viewportHeight) {
    height = piVar6[1];
  }
  CVar4 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar2 - width);
  CVar5 = de::Random::getInt(&rnd,0,piVar6[1] - height);
  tcu::Surface::Surface(&reference);
  tcu::Surface::Surface(&result);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  pCVar1 = &context.super_Context.m_type;
  context.super_Context._vptr_Context = (_func_int **)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar1);
  std::operator<<((ostream *)pCVar1,"Rendering with GL driver");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&context,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar1);
  buffers.m_colorbuffer.m_format.order = CVar4;
  buffers.m_colorbuffer.m_format.type = CVar5;
  buffers.m_colorbuffer.m_size.m_data[0] = width;
  buffers.m_colorbuffer.m_size.m_data[1] = height;
  sglr::GLContext::GLContext(&context,context_00,log,0,(IVec4 *)&buffers);
  this_00 = &this->super_ContextWrapper;
  sglr::ContextWrapper::setContext(this_00,&context.super_Context);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  dVar3 = sglr::ContextWrapper::glGetError(this_00);
  if (dVar3 == 0) {
    sglr::ContextWrapper::setContext(this_00,(Context *)0x0);
    sglr::GLContext::~GLContext(&context);
    pCVar1 = &context.super_Context.m_type;
    context.super_Context._vptr_Context = (_func_int **)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar1);
    std::operator<<((ostream *)pCVar1,"Rendering reference image");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&context,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar1);
    context.super_Context._12_4_ = (uint)(piVar6[5] != 0) << 3;
    context.super_Context._vptr_Context = (_func_int **)0x800000008;
    context.super_Context.m_type.super_ApiType.m_bits = (ApiType)8;
    sglr::ReferenceContextBuffers::ReferenceContextBuffers
              (&buffers,(PixelFormat *)&context,piVar6[6],piVar6[7],width,height,1);
    sglr::ReferenceContextLimits::ReferenceContextLimits
              ((ReferenceContextLimits *)&local_62b0,context_00);
    sglr::ReferenceContextBuffers::getColorbuffer(&local_6208,&buffers);
    sglr::ReferenceContextBuffers::getDepthbuffer(&local_6230,&buffers);
    sglr::ReferenceContextBuffers::getStencilbuffer(&local_6258,&buffers);
    sglr::ReferenceContext::ReferenceContext
              ((ReferenceContext *)&context,(ReferenceContextLimits *)&local_62b0,&local_6208,
               &local_6230,&local_6258);
    sglr::ReferenceContextLimits::~ReferenceContextLimits((ReferenceContextLimits *)&local_62b0);
    sglr::ContextWrapper::setContext(this_00,&context.super_Context);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
    sglr::ContextWrapper::setContext(this_00,(Context *)0x0);
    sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)&context);
    sglr::ReferenceContextBuffers::~ReferenceContextBuffers(&buffers);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                      (this,&reference,&result);
    description = "Image comparison failed";
    if ((byte)iVar2 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)((byte)iVar2 ^ 1),description);
    tcu::Surface::~Surface(&result);
    tcu::Surface::~Surface(&reference);
    return STOP;
  }
  this_01 = (Error *)__cxa_allocate_exception(0x38);
  local_62b0 = glu::getErrorName;
  local_62a8 = dVar3;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)&buffers,&local_62b0);
  glu::Error::Error(this_01,dVar3,
                    (char *)CONCAT44(buffers.m_colorbuffer.m_format.type,
                                     buffers.m_colorbuffer.m_format.order),(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboTestCase.cpp"
                    ,0x5c);
  __cxa_throw(this_01,&glu::Error::typeinfo,glu::Error::~Error);
}

Assistant:

FboTestCase::IterateResult FboTestCase::iterate (void)
{
	glu::RenderContext&			renderCtx		= TestCase::m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget	= renderCtx.getRenderTarget();
	TestLog&					log				= m_testCtx.getLog();

	// Viewport.
	de::Random					rnd				(deStringHash(getName()));
	int							width			= deMin32(renderTarget.getWidth(),	m_viewportWidth);
	int							height			= deMin32(renderTarget.getHeight(),	m_viewportHeight);
	int							x				= rnd.getInt(0, renderTarget.getWidth()		- width);
	int							y				= rnd.getInt(0, renderTarget.getHeight()	- height);

	// Surface format and storage is choosen by render().
	tcu::Surface				reference;
	tcu::Surface				result;

	// Call preCheck() that can throw exception if some requirement is not met.
	preCheck();

	log << TestLog::Message << "Rendering with GL driver" << TestLog::EndMessage;

	// Render using GLES3.1
	try
	{
		sglr::GLContext context(renderCtx, log, 0, tcu::IVec4(x, y, width, height));
		setContext(&context);
		render(result);

		// Check error.
		deUint32 err = glGetError();
		if (err != GL_NO_ERROR)
			throw glu::Error(err, glu::getErrorStr(err).toString().c_str(), DE_NULL, __FILE__, __LINE__);

		setContext(DE_NULL);
	}
	catch (const FboTestUtil::FboIncompleteException& e)
	{
		if (e.getReason() == GL_FRAMEBUFFER_UNSUPPORTED)
		{
			log << e;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
			return STOP;
		}
		else
			throw;
	}

	log << TestLog::Message << "Rendering reference image" << TestLog::EndMessage;

	// Render reference.
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		setContext(&context);
		render(reference);
		setContext(DE_NULL);
	}

	bool isOk = compare(reference, result);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");
	return STOP;
}